

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# talg.c
# Opt level: O2

int supsmu_(int *n,double *x,double *y,double *w,int *iper,double *span,double *alpha,double *smo,
           double *sc)

{
  double *w_00;
  double *pdVar1;
  int iVar2;
  uint uVar3;
  double *acvr;
  uint uVar4;
  long lVar5;
  double *pdVar6;
  int iVar7;
  int *iper_00;
  ulong uVar8;
  double *smo_00;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  double dVar12;
  double dVar13;
  double local_90;
  double h__;
  double *local_80;
  ulong local_78;
  double *local_70;
  double *local_68;
  double *local_60;
  double *local_58;
  int local_4c;
  double local_48;
  double vsmlsq;
  int local_38;
  int local_34;
  
  uVar3 = *n;
  uVar8 = (ulong)(int)uVar3;
  if (x[uVar8 - 1] <= *x) {
    uVar11 = 0;
    uVar8 = 0;
    if (0 < (int)uVar3) {
      uVar8 = (ulong)uVar3;
    }
    dVar12 = 0.0;
    dVar13 = 0.0;
    for (; uVar8 != uVar11; uVar11 = uVar11 + 1) {
      dVar13 = dVar13 + y[uVar11] * w[uVar11];
      dVar12 = dVar12 + w[uVar11];
    }
    for (uVar11 = 0; uVar8 != uVar11; uVar11 = uVar11 + 1) {
      smo[uVar11] = (double)(-(ulong)(0.0 < dVar12) & (ulong)(dVar13 / dVar12));
    }
  }
  else {
    uVar10 = ~uVar8;
    local_58 = sc + uVar10;
    uVar11 = (long)(int)uVar3 / 4 & 0xffffffff;
    iVar7 = (int)((long)(int)uVar3 / 4) * 3;
    while( true ) {
      iVar2 = (int)uVar11;
      if (0.0 < x[(long)iVar7 + -1] - x[(long)iVar2 + -1]) break;
      iVar7 = iVar7 + (uint)(iVar7 < (int)uVar3);
      uVar11 = (ulong)(iVar2 - (uint)(1 < iVar2));
    }
    local_48 = (x[(long)iVar7 + -1] - x[(long)iVar2 + -1]) * consts_.e_1[2];
    local_48 = local_48 * local_48;
    iVar7 = 2 - (uint)(*x < 0.0 || 1.0 < x[uVar8 - 1]);
    if (*iper != 2) {
      iVar7 = *iper;
    }
    local_4c = 1;
    if (0xfffffffd < iVar7 - 3U) {
      local_4c = iVar7;
    }
    vsmlsq = (double)n;
    if (*span <= 0.0) {
      acvr = local_58 + uVar8 * 7 + 1;
      local_34 = -local_4c;
      smo_00 = sc + uVar8 + uVar10 + 1;
      pdVar6 = sc + uVar10 + uVar8 * 2 + 1;
      h__ = (double)x;
      local_80 = acvr;
      local_78 = uVar8;
      local_60 = w;
      for (local_68 = (double *)0x0; pdVar1 = local_58, w_00 = local_60, local_68 != (double *)0x18;
          local_68 = (double *)((long)local_68 + 8)) {
        local_70 = pdVar6;
        smooth_(n,x,y,local_60,(double *)((long)spans_.e_1 + (long)local_68),&local_4c,&local_48,
                smo_00,acvr);
        pdVar6 = local_70;
        local_38 = local_34;
        smooth_(n,x,acvr,w_00,spans_.e_1 + 1,&local_38,&local_48,local_70,&local_90);
        smo_00 = smo_00 + uVar8 * 2;
        pdVar6 = pdVar6 + uVar8 * 2;
      }
      iVar7 = *(int *)vsmlsq;
      if (iVar7 < 1) {
        iVar7 = 0;
      }
      uVar3 = (int)local_78 * 2;
      local_68 = local_58 + local_78 * 6;
      pdVar6 = local_58;
      for (uVar11 = 1; dVar12 = vsmlsq, x = (double *)h__, uVar11 != iVar7 + 1; uVar11 = uVar11 + 1)
      {
        dVar12 = consts_.e_1[0];
        uVar4 = uVar3;
        for (lVar5 = 0; lVar5 != 0x18; lVar5 = lVar5 + 8) {
          dVar13 = pdVar6[uVar11 + (long)(int)uVar4];
          if (dVar13 < dVar12) {
            pdVar1[uVar8 * 7 + uVar11] = *(double *)((long)spans_.e_1 + lVar5);
            dVar12 = dVar13;
          }
          uVar4 = uVar4 + uVar3;
        }
        if ((((0.0 < *alpha) && (*alpha <= 10.0)) && (0.0 < dVar12)) && (dVar12 < local_68[uVar11]))
        {
          dVar12 = pmax(consts_.e_1[1],dVar12 / local_68[uVar11]);
          local_70 = (double *)(spans_.e_1[2] - pdVar1[uVar8 * 7 + uVar11]);
          dVar12 = pow(dVar12,10.0 - *alpha);
          pdVar1[uVar8 * 7 + uVar11] = dVar12 * (double)local_70 + pdVar1[uVar8 * 7 + uVar11];
          pdVar6 = local_58;
        }
      }
      local_38 = local_34;
      smooth_((int *)vsmlsq,(double *)h__,local_80,local_60,spans_.e_1 + 1,&local_38,&local_48,
              pdVar6 + (int)(uVar3 | 1),&local_90);
      uVar4 = (int)local_78 * 4;
      uVar11 = 0;
      uVar8 = (ulong)*(uint *)dVar12;
      if ((int)*(uint *)dVar12 < 1) {
        uVar8 = uVar11;
      }
      lVar5 = (long)(int)uVar3 * 8 + 8;
      for (; dVar12 = spans_.e_1[0], uVar8 * 8 != uVar11; uVar11 = uVar11 + 8) {
        dVar13 = *(double *)((long)pdVar6 + uVar11 + lVar5);
        if (dVar13 <= spans_.e_1[0]) {
          *(double *)((long)pdVar6 + uVar11 + lVar5) = spans_.e_1[0];
          dVar13 = dVar12;
        }
        dVar12 = spans_.e_1[2];
        if (spans_.e_1[2] <= dVar13) {
          *(double *)((long)pdVar6 + uVar11 + lVar5) = spans_.e_1[2];
          dVar13 = dVar12;
        }
        dVar13 = dVar13 - spans_.e_1[1];
        if (0.0 <= dVar13) {
          dVar13 = dVar13 / (spans_.e_1[2] - spans_.e_1[1]);
          uVar9 = local_78 * 5;
        }
        else {
          dVar13 = -dVar13 / (spans_.e_1[1] - spans_.e_1[0]);
          uVar9 = local_78;
        }
        *(double *)((long)pdVar6 + uVar11 + (long)(int)uVar4 * 8 + 8) =
             (1.0 - dVar13) * *(double *)((long)pdVar6 + uVar11 + (long)((int)local_78 * 3) * 8 + 8)
             + dVar13 * *(double *)((long)sc + uVar11 + uVar9 * 8 + uVar10 * 8 + 8);
      }
      iper_00 = &local_38;
      local_38 = local_34;
      y = local_58 + (int)(uVar4 | 1);
      sc = &local_90;
      w = local_60;
      span = spans_.e_1;
    }
    else {
      iper_00 = &local_4c;
    }
    uVar3 = smooth_((int *)vsmlsq,x,y,w,span,iper_00,&local_48,smo,sc);
    uVar8 = (ulong)uVar3;
  }
  return (int)uVar8;
}

Assistant:

static int supsmu_(int *n, double *x, double *y, double *w, int *iper, double *span, double *alpha, double *smo, double *sc)
{
    /* System generated locals */
    int sc_dim1, sc_offset, i__1;
    double r__1, r__2;
    double d__1, d__2;

    /* Local variables */
    double a, f, h__;
    int i__, j;
    double sw, sy;
    int jper;
    double scale, resmin;
    double vsmlsq;


/* ------------------------------------------------------------------ */

/* super-smoother. */

/* Friedman J.H. (1984). A variable span smoother. Department of Statistics, */
/*    Stanford University, Technical Report LCS5. */

/* version 10/10/84. */

/* coded  and copyright (c) 1984 by: */

/*                        Jerome H. Friedman */
/*                     Department of Statistics */
/*                               and */
/*                Stanford Linear Accelerator Center */
/*                        Stanford University */

/* all rights reserved. */


/* input: */
/*    n : number of observations (x,y - pairs). */
/*    x(n) : ordered abscissa values. */
/*    y(n) : corresponding ordinate (response) values. */
/*    w(n) : weight for each (x,y) observation. */
/*    iper : periodic variable flag. */
/*       iper=1 => x is ordered interval variable. */
/*       iper=2 => x is a periodic variable with values */
/*                 in the range (0.0,1.0) and period 1.0. */
/*    span : smoother span (fraction of observations in window). */
/*           span=0.0 => automatic (variable) span selection. */
/*    alpha : controles high frequency (small span) penality */
/*            used with automatic span selection (bass tone control). */
/*            (alpha.le.0.0 or alpha.gt.10.0 => no effect.) */
/* output: */
/*   smo(n) : smoothed ordinate (response) values. */
/* scratch: */
/*   sc(n,7) : internal working storage. */

/* note: */
/*    for small samples (n < 40) or if there are substantial serial */
/*    correlations between obserations close in x - value, then */
/*    a prespecified fixed span smoother (span > 0) should be */
/*    used. reasonable span values are 0.2 to 0.4. */

/* ------------------------------------------------------------------ */

    /* Parameter adjustments */
    sc_dim1 = *n;
    sc_offset = 1 + sc_dim1;
    sc -= sc_offset;
    --smo;
    --w;
    --y;
    --x;

    /* Function Body */
    if (x[*n] > x[1]) {
	goto L30;
    }
    sy = 0.0;
    sw = sy;
    i__1 = *n;
    for (j = 1; j <= i__1; ++j) {
	sy += w[j] * y[j];
	sw += w[j];
/* L10: */
    }
    a = 0.0;
    if (sw > 0.0) {
	a = sy / sw;
    }
    i__1 = *n;
    for (j = 1; j <= i__1; ++j) {
	smo[j] = a;
/* L20: */
    }
    return 0;
L30:
    i__ = *n / 4;
    j = i__ * 3;
    scale = x[j] - x[i__];
L40:
    if (scale > 0.f) {
	goto L50;
    }
    if (j < *n) {
	++j;
    }
    if (i__ > 1) {
	--i__;
    }
    scale = x[j] - x[i__];
    goto L40;
L50:
/* Computing 2nd power */
    r__1 = consts_1.eps * scale;
    vsmlsq = r__1 * r__1;
    jper = *iper;
    if (*iper == 2 && (x[1] < 0.0 || x[*n] > 1.0)) {
	jper = 1;
    }
    if (jper < 1 || jper > 2) {
	jper = 1;
    }
    if (*span <= 0.0) {
	goto L60;
    }
    smooth_(n, &x[1], &y[1], &w[1], span, &jper, &vsmlsq, &smo[1], &sc[
	    sc_offset]);
    return 0;
L60:
    for (i__ = 1; i__ <= 3; ++i__) {
	smooth_(n, &x[1], &y[1], &w[1], &spans_1.spans[i__ - 1], &jper, &
		vsmlsq, &sc[((i__ << 1) - 1) * sc_dim1 + 1], &sc[sc_dim1 * 7 
		+ 1]);
	i__1 = -jper;
	smooth_(n, &x[1], &sc[sc_dim1 * 7 + 1], &w[1], &spans_1.spans[1], &
		i__1, &vsmlsq, &sc[(i__ << 1) * sc_dim1 + 1], &h__);
/* L70: */
    }
    i__1 = *n;
    for (j = 1; j <= i__1; ++j) {
	resmin = consts_1.big;
	for (i__ = 1; i__ <= 3; ++i__) {
	    if (sc[j + (i__ << 1) * sc_dim1] >= resmin) {
		goto L80;
	    }
	    resmin = sc[j + (i__ << 1) * sc_dim1];
	    sc[j + sc_dim1 * 7] = spans_1.spans[i__ - 1];
L80:
	    ;
	}
	if (*alpha > 0.f && *alpha <= 10.f && resmin < sc[j + sc_dim1 * 6] && 
		resmin > 0.f) {
/* Computing MAX */
	    r__1 = consts_1.sml, r__2 = resmin / sc[j + sc_dim1 * 6];
	    d__1 = (double) pmax(r__1,r__2);
	    d__2 = (double) (10.0 - *alpha);
	    sc[j + sc_dim1 * 7] += (spans_1.spans[2] - sc[j + sc_dim1 * 7]) * 
		    pow(d__1, d__2);
	}
/* L90: */
    }
    i__1 = -jper;
    smooth_(n, &x[1], &sc[sc_dim1 * 7 + 1], &w[1], &spans_1.spans[1], &i__1, &
	    vsmlsq, &sc[(sc_dim1 << 1) + 1], &h__);
    i__1 = *n;
    for (j = 1; j <= i__1; ++j) {
	if (sc[j + (sc_dim1 << 1)] <= spans_1.spans[0]) {
	    sc[j + (sc_dim1 << 1)] = spans_1.spans[0];
	}
	if (sc[j + (sc_dim1 << 1)] >= spans_1.spans[2]) {
	    sc[j + (sc_dim1 << 1)] = spans_1.spans[2];
	}
	f = sc[j + (sc_dim1 << 1)] - spans_1.spans[1];
	if (f >= 0.f) {
	    goto L100;
	}
	f = -f / (spans_1.spans[1] - spans_1.spans[0]);
	sc[j + (sc_dim1 << 2)] = (1.f - f) * sc[j + sc_dim1 * 3] + f * sc[j + 
		sc_dim1];
	goto L110;
L100:
	f /= spans_1.spans[2] - spans_1.spans[1];
	sc[j + (sc_dim1 << 2)] = (1.f - f) * sc[j + sc_dim1 * 3] + f * sc[j + 
		sc_dim1 * 5];
L110:
	;
    }
    i__1 = -jper;
    smooth_(n, &x[1], &sc[(sc_dim1 << 2) + 1], &w[1], spans_1.spans, &i__1, &
	    vsmlsq, &smo[1], &h__);
    return 0;
}